

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

int __thiscall BinNE<0,_0,_1>::checkSatisfied(BinNE<0,_0,_1> *this)

{
  Tchar *pTVar1;
  IntVar *pIVar2;
  IntVar *pIVar3;
  int iVar4;
  int *pt;
  TrailElem local_18;
  
  if ((this->super_Propagator).satisfied.v != '\0') {
    return 1;
  }
  pTVar1 = &(this->super_Propagator).satisfied;
  local_18.pt = (int *)pTVar1;
  if ((uint)(this->r).s * 2 + -1 == (int)sat.assigns.data[(uint)(this->r).v]) {
    local_18.x = 0;
    local_18.sz = 1;
    vec<TrailElem>::push(&engine.trail,&local_18);
    iVar4 = 1;
  }
  else {
    pIVar2 = (this->x).var;
    pIVar3 = (this->y).var;
    if (((pIVar2->min).v <= (pIVar3->max).v) && ((pIVar3->min).v <= (pIVar2->max).v)) {
      return 3;
    }
    local_18.x = 0;
    local_18.sz = 1;
    vec<TrailElem>::push(&engine.trail,&local_18);
    iVar4 = 3;
  }
  pTVar1->v = '\x01';
  return iVar4;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() > y.getMax() || x.getMax() < y.getMin()) {
			satisfied = true;
		}
		return 3;
	}